

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::BitwiseOrExp(SQParser *this)

{
  uint uVar1;
  uint32_t uVar2;
  Expr *pEVar3;
  
  uVar1 = this->_depth;
  if (500 < uVar1) {
    reportDiagnostic(this,0x1d);
    uVar1 = this->_depth;
  }
  this->_depth = uVar1 + 1;
  pEVar3 = BitwiseXorExp(this);
  uVar1 = this->_depth;
  if (500 < uVar1) {
    reportDiagnostic(this,0x1d);
    uVar1 = this->_depth;
  }
  uVar2 = uVar1 + 1;
  this->_depth = uVar2;
  if (this->_token == 0x7c) {
    pEVar3 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                       (this,0x161b3e,TO_BLOCK,(Expr *)0x17);
    uVar2 = this->_depth;
  }
  this->_depth = uVar2 - 2;
  return pEVar3;
}

Assistant:

Expr* SQParser::BitwiseOrExp()
{
    NestingChecker nc(this);
    Expr *lhs = BitwiseXorExp();
    for (;;) {
        nc.inc();
        if (_token == _SC('|')) {
            return BIN_EXP(&SQParser::BitwiseOrExp, TO_OR, lhs);
        }
        else return lhs;
    }
}